

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cc
# Opt level: O0

void __thiscall gimage::View::View(View *this)

{
  long in_RDI;
  int in_stack_ffffffffffffffcc;
  long w;
  Image<float,_gimage::PixelTraits<float>_> *this_00;
  
  this_00 = (Image<float,_gimage::PixelTraits<float>_> *)0x0;
  w = in_RDI;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image
            ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)0x0,in_RDI,in_RDI,
             in_stack_ffffffffffffffcc);
  Image<float,_gimage::PixelTraits<float>_>::Image(this_00,w,in_RDI,in_stack_ffffffffffffffcc);
  *(undefined8 *)(in_RDI + 0x70) = 0;
  *(undefined4 *)(in_RDI + 0x78) = 0x3f800000;
  return;
}

Assistant:

View::View()
{
  camera=0;
  step=1;
}